

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O0

convertable * __thiscall
mpt::collection::relation::find(relation *this,type_t type,char *name,int nlen)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  undefined4 extraout_var;
  relation *local_88;
  undefined4 local_80;
  size_t plen;
  char *sep;
  item_match m;
  int nlen_local;
  char *name_local;
  type_t type_local;
  relation *this_local;
  
  m._44_4_ = nlen;
  if (nlen < 0) {
    if (name == (char *)0x0) {
      local_80 = 0;
    }
    else {
      sVar2 = strlen(name);
      local_80 = (undefined4)sVar2;
    }
    m._44_4_ = local_80;
  }
  sep = (char *)0x0;
  m.ident = (char *)(long)(int)m._44_4_;
  m.curr = 0;
  m.conv = (convertable *)name;
  if ((this->_sep != '\0') && (name != (char *)0x0)) {
    pvVar3 = memchr(name,(int)this->_sep,(long)(int)m._44_4_);
    if (pvVar3 != (void *)0x0) {
      m.ident = (char *)((long)pvVar3 - (long)name);
      m.curr = ((long)(int)m._44_4_ - (long)m.ident) - 1;
    }
  }
  m.type._0_1_ = this->_sep;
  m.left = type;
  iVar1 = (**this->_curr->_vptr_collection)(this->_curr,find_item,&sep);
  if ((iVar1 < 0) || (sep == (char *)0x0)) {
    if (this->_parent == (relation *)0x0) {
      local_88 = (relation *)0x0;
    }
    else {
      iVar1 = (**this->_parent->_vptr_relation)(this->_parent,type,name,(ulong)(uint)m._44_4_);
      local_88 = (relation *)CONCAT44(extraout_var,iVar1);
    }
    this_local = local_88;
  }
  else {
    this_local = (relation *)sep;
  }
  return (convertable *)this_local;
}

Assistant:

convertable *collection::relation::find(type_t type, const char *name, int nlen) const
{
	struct item_match m;
	const char *sep;
	
	if (nlen < 0) nlen = name ? strlen(name) : 0;
	
	m.conv = 0;
	m.ident = name;
	m.curr = nlen;
	m.left = 0;
	if (_sep && name && (sep = (char *) memchr(name, _sep, nlen))) {
		size_t plen = sep - name;
		m.curr = plen;
		m.left = nlen - plen - 1;
	}
	m.type = type;
	m.sep = _sep;
	
	if (_curr.each(find_item, &m) >= 0 && m.conv) {
		return m.conv;
	}
	return _parent ? _parent->find(type, name, nlen) : 0;
}